

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void * SyMemBackendPoolAlloc(SyMemBackend *pBackend,sxu32 nByte)

{
  uint uVar1;
  SyMemHeader *pSVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  sxu32 *psVar7;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  if (nByte < 0x7ff8) {
    if (nByte == 0) {
      uVar1 = 0;
    }
    else {
      uVar3 = 8;
      uVar1 = 0;
      do {
        uVar3 = uVar3 * 2;
        uVar1 = uVar1 + 1;
      } while (uVar3 < nByte + 8);
    }
    pSVar2 = pBackend->apPool[uVar1];
    if (pSVar2 == (SyMemHeader *)0x0) {
      pSVar2 = (SyMemHeader *)MemBackendAlloc(pBackend,0x8000);
      if (pSVar2 == (SyMemHeader *)0x0) goto LAB_0010b747;
      uVar5 = (ulong)(uint)(1 << ((byte)(uVar1 + 3) & 0x1f));
      pBackend->apPool[uVar1] = pSVar2;
      if (uVar1 + 3 < 0xf) {
        lVar4 = 0;
        uVar6 = uVar5;
        do {
          *(ulong *)((long)pSVar2 + lVar4) = (long)pSVar2 + uVar6;
          uVar6 = uVar6 + uVar5;
          lVar4 = lVar4 + uVar5;
        } while (uVar6 < 0x8000);
        pSVar2 = (SyMemHeader *)((long)pSVar2 + lVar4);
      }
      pSVar2->pNext = (SyMemHeader *)0x0;
      pSVar2 = pBackend->apPool[uVar1];
    }
    *(SyMemHeader *)(pBackend->apPool + uVar1) = *pSVar2;
    pSVar2->nBucket = uVar1 | 0xdead0000;
  }
  else {
    pSVar2 = (SyMemHeader *)MemBackendAlloc(pBackend,nByte + 8);
    if (pSVar2 == (SyMemHeader *)0x0) {
LAB_0010b747:
      psVar7 = (sxu32 *)0x0;
      goto LAB_0010b74a;
    }
    pSVar2->nBucket = 0xdeadffff;
  }
  psVar7 = &pSVar2->nBucket + 2;
LAB_0010b74a:
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xLeave)(pBackend->pMutex);
  }
  return psVar7;
}

Assistant:

JX9_PRIVATE void * SyMemBackendPoolAlloc(SyMemBackend *pBackend, sxu32 nByte)
{
	void *pChunk;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend) ){
		return 0;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	pChunk = MemBackendPoolAlloc(&(*pBackend), nByte);
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return pChunk;
}